

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O0

optional<wasm::Name> * __thiscall
wasm::WATParser::anon_unknown_11::ParseInput::takeID
          (optional<wasm::Name> *__return_storage_ptr__,ParseInput *this)

{
  bool bVar1;
  Token *this_00;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  allocator<char> local_b1;
  string local_b0;
  Name local_90 [2];
  undefined1 local_70 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> id;
  optional<wasm::WATParser::Token> t;
  ParseInput *this_local;
  
  peek((optional<wasm::WATParser::Token> *)
       &id.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
        _M_payload.
        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
        _M_engaged,this);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &id.
                      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                      ._M_payload.
                      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ._M_engaged);
  if (bVar1) {
    this_00 = std::optional<wasm::WATParser::Token>::operator->
                        ((optional<wasm::WATParser::Token> *)
                         &id.
                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_engaged);
    Token::getID((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_70,
                 this_00);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_70);
    if (bVar1) {
      Lexer::operator++(&this->lexer);
      __t = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::operator*
                      ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_70)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_b0,__t,&local_b1);
      wasm::Name::Name(local_90,&local_b0);
      std::optional<wasm::Name>::optional<wasm::Name,_true>(__return_storage_ptr__,local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      bVar1 = true;
      goto LAB_01d250f3;
    }
  }
  bVar1 = false;
LAB_01d250f3:
  std::optional<wasm::WATParser::Token>::~optional
            ((optional<wasm::WATParser::Token> *)
             &id.
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_engaged);
  if (!bVar1) {
    std::optional<wasm::Name>::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Name> takeID() {
    if (auto t = peek()) {
      if (auto id = t->getID()) {
        ++lexer;
        // See comment on takeName.
        return Name(std::string(*id));
      }
    }
    return {};
  }